

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupRemovePis(Gia_Man_t *p,int nRemPis)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nRemPis_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_2c = 1;
  do {
    bVar6 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      return p_00;
    }
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_28);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjCioId(pGStack_28);
        iVar2 = Gia_ManCiNum(p);
        if (iVar1 < iVar2 - nRemPis) {
          uVar3 = Gia_ManAppendCi(p_00);
          pGStack_28->Value = uVar3;
          goto LAB_001e155f;
        }
      }
      iVar1 = Gia_ObjIsCo(pGStack_28);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pGStack_28);
        uVar3 = Gia_ManAppendCo(p_00,iVar1);
        pGStack_28->Value = uVar3;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar2 = Gia_ObjFanin1Copy(pGStack_28);
      uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
      pGStack_28->Value = uVar3;
    }
LAB_001e155f:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupRemovePis( Gia_Man_t * p, int nRemPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) < Gia_ManCiNum(p)-nRemPis )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}